

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iadst4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  int32_t iVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  byte bVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  long lVar13;
  int iVar14;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar15 [16];
  int iVar19;
  int iVar20;
  int iVar22;
  uint uVar23;
  int iVar24;
  undefined1 auVar21 [16];
  int iVar25;
  int iVar26;
  int iVar28;
  int iVar29;
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  
  iVar10 = bit + -10;
  auVar12 = ZEXT416((uint)(1 << ((char)bit + 3U & 0x1f)));
  auVar12 = insertps(auVar12,auVar12,0x2a);
  iVar4 = av1_sinpi_arr_data[iVar10][1];
  auVar48._4_4_ = iVar4;
  auVar48._0_4_ = iVar4;
  auVar48._8_4_ = iVar4;
  auVar48._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar10][2];
  auVar46._4_4_ = iVar4;
  auVar46._0_4_ = iVar4;
  auVar46._8_4_ = iVar4;
  auVar46._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar10][3];
  auVar38._4_4_ = iVar4;
  auVar38._0_4_ = iVar4;
  auVar38._8_4_ = iVar4;
  auVar38._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar10][4];
  auVar36._4_4_ = iVar4;
  auVar36._0_4_ = iVar4;
  auVar36._8_4_ = iVar4;
  auVar36._12_4_ = iVar4;
  alVar1 = *in;
  alVar2 = in[2];
  alVar3 = in[3];
  auVar49 = pmulld((undefined1  [16])alVar1,auVar48);
  auVar15 = pmulld((undefined1  [16])alVar1,auVar46);
  auVar27 = pmulld((undefined1  [16])in[1],auVar38);
  auVar50 = pmulld((undefined1  [16])alVar2,auVar36);
  auVar21 = pmulld(auVar46,(undefined1  [16])alVar3);
  iVar20 = auVar21._0_4_ + auVar50._0_4_ + auVar49._0_4_;
  iVar22 = auVar21._4_4_ + auVar50._4_4_ + auVar49._4_4_;
  iVar24 = auVar21._8_4_ + auVar50._8_4_ + auVar49._8_4_;
  iVar25 = auVar21._12_4_ + auVar50._12_4_ + auVar49._12_4_;
  auVar21._0_4_ = ((int)alVar1[0] - (int)alVar2[0]) + (int)alVar3[0];
  auVar21._4_4_ = (alVar1[0]._4_4_ - alVar2[0]._4_4_) + alVar3[0]._4_4_;
  auVar21._8_4_ = ((int)alVar1[1] - (int)alVar2[1]) + (int)alVar3[1];
  auVar21._12_4_ = (alVar1[1]._4_4_ - alVar2[1]._4_4_) + alVar3[1]._4_4_;
  auVar46 = pmulld((undefined1  [16])alVar2,auVar48);
  auVar49 = pmulld((undefined1  [16])alVar3,auVar36);
  iVar10 = auVar15._0_4_ - (auVar49._0_4_ + auVar46._0_4_);
  iVar16 = auVar15._4_4_ - (auVar49._4_4_ + auVar46._4_4_);
  iVar18 = auVar15._8_4_ - (auVar49._8_4_ + auVar46._8_4_);
  iVar19 = auVar15._12_4_ - (auVar49._12_4_ + auVar46._12_4_);
  auVar21 = pmulld(auVar21,auVar38);
  iVar26 = auVar27._0_4_;
  iVar28 = auVar27._4_4_;
  iVar29 = auVar27._8_4_;
  iVar30 = auVar27._12_4_;
  iVar14 = (iVar10 - iVar26) + iVar20;
  iVar17 = (iVar16 - iVar28) + iVar22;
  auVar15._0_8_ = CONCAT44(iVar17,iVar14);
  auVar15._8_4_ = (iVar18 - iVar29) + iVar24;
  auVar15._12_4_ = (iVar19 - iVar30) + iVar25;
  iVar20 = iVar20 + iVar26;
  iVar22 = iVar22 + iVar28;
  auVar31._0_8_ = CONCAT44(iVar22,iVar20);
  auVar31._8_4_ = iVar24 + iVar29;
  auVar31._12_4_ = iVar25 + iVar30;
  iVar10 = iVar10 + iVar26;
  iVar16 = iVar16 + iVar28;
  auVar41._0_8_ = CONCAT44(iVar16,iVar10);
  auVar41._8_4_ = iVar18 + iVar29;
  auVar41._12_4_ = iVar19 + iVar30;
  uVar23 = iVar20 >> 0x1c;
  auVar5._4_8_ = 0;
  auVar5._0_4_ = uVar23;
  auVar49._0_12_ = auVar5 << 0x20;
  auVar49._12_4_ = auVar31._8_4_ >> 0x1c;
  auVar37._0_8_ = (ulong)(auVar31._0_8_ << 0x20) >> 0x1c;
  auVar37._8_8_ = (ulong)(auVar31._8_8_ << 0x20) >> 0x1c;
  auVar38 = pblendw(auVar37,auVar49,0xcc);
  lVar11 = auVar12._0_8_;
  lVar13 = auVar12._8_8_;
  auVar12 = pblendw(auVar31,(undefined1  [16])0x0,0x33);
  auVar32._4_4_ = iVar22 >> 0x1c;
  auVar32._0_4_ = uVar23;
  auVar32._8_4_ = auVar49._12_4_;
  auVar32._12_4_ = auVar31._12_4_ >> 0x1c;
  auVar47._0_8_ = auVar12._0_8_ >> 0x1c;
  auVar47._8_8_ = auVar12._8_8_ >> 0x1c;
  auVar48 = pblendw(auVar47,auVar32,0xcc);
  uVar23 = iVar10 >> 0x1c;
  auVar6._4_8_ = 0;
  auVar6._0_4_ = uVar23;
  auVar39._0_12_ = auVar6 << 0x20;
  auVar39._12_4_ = auVar41._8_4_ >> 0x1c;
  auVar33._0_8_ = (ulong)(auVar41._0_8_ << 0x20) >> 0x1c;
  auVar33._8_8_ = (ulong)(auVar41._8_8_ << 0x20) >> 0x1c;
  auVar46 = pblendw(auVar33,auVar39,0xcc);
  auVar12 = pblendw(auVar41,(undefined1  [16])0x0,0x33);
  auVar44._4_4_ = iVar16 >> 0x1c;
  auVar44._0_4_ = uVar23;
  auVar44._8_4_ = auVar39._12_4_;
  auVar44._12_4_ = auVar41._12_4_ >> 0x1c;
  auVar40._0_8_ = auVar12._0_8_ >> 0x1c;
  auVar40._8_8_ = auVar12._8_8_ >> 0x1c;
  auVar41 = pblendw(auVar40,auVar44,0xcc);
  uVar23 = auVar21._0_4_ >> 0x1c;
  auVar7._4_8_ = 0;
  auVar7._0_4_ = uVar23;
  auVar42._0_12_ = auVar7 << 0x20;
  auVar42._12_4_ = auVar21._8_4_ >> 0x1c;
  auVar34._0_8_ = (ulong)(auVar21._0_8_ << 0x20) >> 0x1c;
  auVar34._8_8_ = (ulong)(auVar21._8_8_ << 0x20) >> 0x1c;
  auVar49 = pblendw(auVar34,auVar42,0xcc);
  auVar12 = pblendw(auVar21,(undefined1  [16])0x0,0x33);
  auVar27._4_4_ = auVar21._4_4_ >> 0x1c;
  auVar27._0_4_ = uVar23;
  auVar27._8_4_ = auVar42._12_4_;
  auVar27._12_4_ = auVar21._12_4_ >> 0x1c;
  auVar43._0_8_ = auVar12._0_8_ >> 0x1c;
  auVar43._8_8_ = auVar12._8_8_ >> 0x1c;
  auVar44 = pblendw(auVar43,auVar27,0xcc);
  uVar23 = iVar14 >> 0x1c;
  auVar8._4_8_ = 0;
  auVar8._0_4_ = uVar23;
  auVar45._0_12_ = auVar8 << 0x20;
  auVar45._12_4_ = auVar15._8_4_ >> 0x1c;
  auVar35._0_8_ = (ulong)(auVar15._0_8_ << 0x20) >> 0x1c;
  auVar35._8_8_ = (ulong)(auVar15._8_8_ << 0x20) >> 0x1c;
  auVar27 = pblendw(auVar35,auVar45,0xcc);
  auVar21 = pblendw((undefined1  [16])0x0,auVar15,0xcc);
  auVar12._4_4_ = iVar17 >> 0x1c;
  auVar12._0_4_ = uVar23;
  auVar12._8_4_ = auVar45._12_4_;
  auVar12._12_4_ = auVar15._12_4_ >> 0x1c;
  auVar50._0_8_ = auVar21._0_8_ >> 0x1c;
  auVar50._8_8_ = auVar21._8_8_ >> 0x1c;
  auVar12 = pblendw(auVar50,auVar12,0xcc);
  (*out)[0] = CONCAT44((int)((ulong)(auVar48._0_8_ + lVar11) >> 0x10),
                       (int)((ulong)(auVar38._0_8_ + lVar11) >> 0x10));
  (*out)[1] = CONCAT44((int)((ulong)(auVar48._8_8_ + lVar13) >> 0x10),
                       (int)((ulong)(auVar38._8_8_ + lVar13) >> 0x10));
  out[1][0] = CONCAT44((int)((ulong)(auVar41._0_8_ + lVar11) >> 0x10),
                       (int)((ulong)(auVar46._0_8_ + lVar11) >> 0x10));
  out[1][1] = CONCAT44((int)((ulong)(auVar41._8_8_ + lVar13) >> 0x10),
                       (int)((ulong)(auVar46._8_8_ + lVar13) >> 0x10));
  out[2][0] = CONCAT44((int)((ulong)(auVar44._0_8_ + lVar11) >> 0x10),
                       (int)((ulong)(auVar49._0_8_ + lVar11) >> 0x10));
  out[2][1] = CONCAT44((int)((ulong)(auVar44._8_8_ + lVar13) >> 0x10),
                       (int)((ulong)(auVar49._8_8_ + lVar13) >> 0x10));
  out[3][0] = CONCAT44((int)((ulong)(auVar12._0_8_ + lVar11) >> 0x10),
                       (int)((ulong)(auVar27._0_8_ + lVar11) >> 0x10));
  out[3][1] = CONCAT44((int)((ulong)(auVar12._8_8_ + lVar13) >> 0x10),
                       (int)((ulong)(auVar27._8_8_ + lVar13) >> 0x10));
  if (do_cols == 0) {
    bVar9 = 10;
    if (10 < bd) {
      bVar9 = (byte)bd;
    }
    iVar10 = 0x20 << (bVar9 & 0x1f);
    clamp_lo[0]._0_4_ = -iVar10;
    clamp_hi[0]._0_4_ = iVar10 + -1;
    clamp_hi[0]._4_4_ = (int)clamp_hi[0];
    clamp_hi[1]._0_4_ = (int)clamp_hi[0];
    clamp_hi[1]._4_4_ = (int)clamp_hi[0];
    clamp_lo[0]._4_4_ = (int)clamp_lo[0];
    clamp_lo[1]._0_4_ = (int)clamp_lo[0];
    clamp_lo[1]._4_4_ = (int)clamp_lo[0];
    round_shift_4x4(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo,&clamp_hi,4);
  }
  return;
}

Assistant:

static void iadst4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *sinpi = sinpi_arr(bit);
  const __m128i zero = _mm_setzero_si128();
  __m128i rnding = _mm_set1_epi32(1 << (bit + 4 - 1));
  rnding = _mm_unpacklo_epi32(rnding, zero);
  const __m128i mul = _mm_set1_epi32(1 << 4);
  const __m128i sinpi1 = _mm_set1_epi32((int)sinpi[1]);
  const __m128i sinpi2 = _mm_set1_epi32((int)sinpi[2]);
  const __m128i sinpi3 = _mm_set1_epi32((int)sinpi[3]);
  const __m128i sinpi4 = _mm_set1_epi32((int)sinpi[4]);
  __m128i t;
  __m128i s0, s1, s2, s3, s4, s5, s6, s7;
  __m128i x0, x1, x2, x3;
  __m128i u0, u1, u2, u3;
  __m128i u0_low, u1_low, u2_low, u3_low;
  __m128i u0_high, u1_high, u2_high, u3_high;

  x0 = in[0];
  x1 = in[1];
  x2 = in[2];
  x3 = in[3];

  s0 = _mm_mullo_epi32(x0, sinpi1);
  s1 = _mm_mullo_epi32(x0, sinpi2);
  s2 = _mm_mullo_epi32(x1, sinpi3);
  s3 = _mm_mullo_epi32(x2, sinpi4);
  s4 = _mm_mullo_epi32(x2, sinpi1);
  s5 = _mm_mullo_epi32(x3, sinpi2);
  s6 = _mm_mullo_epi32(x3, sinpi4);
  t = _mm_sub_epi32(x0, x2);
  s7 = _mm_add_epi32(t, x3);

  t = _mm_add_epi32(s0, s3);
  s0 = _mm_add_epi32(t, s5);
  t = _mm_sub_epi32(s1, s4);
  s1 = _mm_sub_epi32(t, s6);
  s3 = s2;
  s2 = _mm_mullo_epi32(s7, sinpi3);

  u0 = _mm_add_epi32(s0, s3);
  u1 = _mm_add_epi32(s1, s3);
  u2 = s2;
  t = _mm_add_epi32(s0, s1);
  u3 = _mm_sub_epi32(t, s3);

  // u0
  u0_low = _mm_mul_epi32(u0, mul);
  u0_low = _mm_add_epi64(u0_low, rnding);

  u0 = _mm_srli_si128(u0, 4);
  u0_high = _mm_mul_epi32(u0, mul);
  u0_high = _mm_add_epi64(u0_high, rnding);

  u0_low = _mm_srli_si128(u0_low, 2);
  u0_high = _mm_srli_si128(u0_high, 2);

  u0 = _mm_unpacklo_epi32(u0_low, u0_high);
  u0_high = _mm_unpackhi_epi32(u0_low, u0_high);
  u0 = _mm_unpacklo_epi64(u0, u0_high);

  // u1
  u1_low = _mm_mul_epi32(u1, mul);
  u1_low = _mm_add_epi64(u1_low, rnding);

  u1 = _mm_srli_si128(u1, 4);
  u1_high = _mm_mul_epi32(u1, mul);
  u1_high = _mm_add_epi64(u1_high, rnding);

  u1_low = _mm_srli_si128(u1_low, 2);
  u1_high = _mm_srli_si128(u1_high, 2);

  u1 = _mm_unpacklo_epi32(u1_low, u1_high);
  u1_high = _mm_unpackhi_epi32(u1_low, u1_high);
  u1 = _mm_unpacklo_epi64(u1, u1_high);

  // u2
  u2_low = _mm_mul_epi32(u2, mul);
  u2_low = _mm_add_epi64(u2_low, rnding);

  u2 = _mm_srli_si128(u2, 4);
  u2_high = _mm_mul_epi32(u2, mul);
  u2_high = _mm_add_epi64(u2_high, rnding);

  u2_low = _mm_srli_si128(u2_low, 2);
  u2_high = _mm_srli_si128(u2_high, 2);

  u2 = _mm_unpacklo_epi32(u2_low, u2_high);
  u2_high = _mm_unpackhi_epi32(u2_low, u2_high);
  u2 = _mm_unpacklo_epi64(u2, u2_high);

  // u3
  u3_low = _mm_mul_epi32(u3, mul);
  u3_low = _mm_add_epi64(u3_low, rnding);

  u3 = _mm_srli_si128(u3, 4);
  u3_high = _mm_mul_epi32(u3, mul);
  u3_high = _mm_add_epi64(u3_high, rnding);

  u3_low = _mm_srli_si128(u3_low, 2);
  u3_high = _mm_srli_si128(u3_high, 2);

  u3 = _mm_unpacklo_epi32(u3_low, u3_high);
  u3_high = _mm_unpackhi_epi32(u3_low, u3_high);
  u3 = _mm_unpacklo_epi64(u3, u3_high);

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 4);
  }
}